

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O1

base_learner * print_setup(options_i *options,vw *all)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  learner<print,_example> *plVar2;
  bool print_option;
  option_group_definition new_options;
  free_ptr<print> p;
  bool local_209;
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  string local_1e8;
  option_group_definition local_1c8;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180 [16];
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  typed_option<bool> local_d0;
  
  local_209 = false;
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Print psuedolearner","");
  paVar1 = &local_1c8.m_name.field_2;
  local_1c8.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1c8,local_190,local_190 + local_188);
  local_1c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"print","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_170,&local_1e8,&local_209);
  local_100 = true;
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"print examples","");
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_170);
  VW::config::option_group_definition::add<bool>(&local_1c8,&local_d0);
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cafb0;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0]);
  }
  local_170._0_8_ = &PTR__typed_option_002cafb0;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options);
  if (local_209 == false) {
    plVar2 = (learner<print,_example> *)0x0;
  }
  else {
    local_170._8_8_ = calloc_or_throw<print>(1);
    ((print *)local_170._8_8_)->all = (vw *)0x0;
    local_170._0_8_ = destroy_free<print>;
    ((print *)local_170._8_8_)->all = all;
    if ((all->weights).sparse == true) {
      sparse_parameters::stride_shift(&(all->weights).sparse_weights,0);
    }
    else {
      (all->weights).dense_weights._stride_shift = 0;
    }
    plVar2 = LEARNER::init_learner<print,example,LEARNER::learner<char,char>>
                       ((free_ptr<print> *)local_170,learn,learn,1);
    if ((print *)local_170._8_8_ != (print *)0x0) {
      (*(code *)local_170._0_8_)();
    }
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_1c8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8.m_name._M_dataplus._M_p);
  }
  return (base_learner *)plVar2;
}

Assistant:

LEARNER::base_learner* print_setup(options_i& options, vw& all)
{
  bool print_option = false;
  option_group_definition new_options("Print psuedolearner");
  new_options.add(make_option("print", print_option).keep().help("print examples"));
  options.add_and_parse(new_options);

  if (!print_option)
    return nullptr;

  auto p = scoped_calloc_or_throw<print>();
  p->all = &all;

  all.weights.stride_shift(0);

  LEARNER::learner<print, example>& ret = init_learner(p, learn, learn, 1);
  return make_base(ret);
}